

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O3

char * __cxxabiv1::anon_unknown_0::parse_static_cast_expr<__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,Db *db)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar2;
  undefined7 uVar3;
  char *first_00;
  char *pcVar4;
  string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
  *this;
  pointer psVar5;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  expr;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_130;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_110;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_f0;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *local_b0;
  undefined8 local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  local_a0;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_90;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_70;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_50;
  
  if ((((2 < (long)last - (long)first) && (*first == 's')) && (first[1] == 'c')) &&
     (((first_00 = parse_type<__cxxabiv1::(anonymous_namespace)::Db>(first + 2,last,db),
       first_00 != first + 2 &&
       (pcVar4 = parse_expression<__cxxabiv1::(anonymous_namespace)::Db>(first_00,last,db),
       pcVar4 != first_00)) &&
      (psVar5 = (db->names).
                super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                ._M_impl.super__Vector_impl_data._M_finish,
      0x40 < (ulong)((long)psVar5 -
                    (long)(db->names).
                          super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                          ._M_impl.super__Vector_impl_data._M_start))))) {
    this = psVar5 + -1;
    string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
    ::move_full(&local_90,this);
    psVar5 = (db->names).
             super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    (db->names).
    super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar5;
    std::
    allocator_traits<__cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>,4096ul>>
    ::
    destroy<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>>
              ((short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>
                *)psVar5,this);
    string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
    ::move_full(&local_d0,
                (db->names).
                super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1);
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::replace(&local_d0,0,0,"static_cast<",0xc);
    paVar1 = &local_130.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
      local_130.field_2._8_8_ = local_d0.field_2._8_8_;
      local_130._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_130._M_dataplus._M_p = local_d0._M_dataplus._M_p;
    }
    local_130.field_2._M_allocated_capacity._1_7_ = local_d0.field_2._M_allocated_capacity._1_7_;
    local_130._M_string_length = local_d0._M_string_length;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_local_buf[0] = '\0';
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::append(&local_130,">(");
    paVar2 = &local_110.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_130._M_dataplus._M_p == paVar1) {
      local_110.field_2._8_8_ = local_130.field_2._8_8_;
      local_110._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_110._M_dataplus._M_p = local_130._M_dataplus._M_p;
    }
    local_110.field_2._M_allocated_capacity._1_7_ = local_130.field_2._M_allocated_capacity._1_7_;
    local_110._M_string_length = local_130._M_string_length;
    local_130._M_string_length = 0;
    local_130.field_2._M_allocated_capacity =
         (ulong)(uint7)local_130.field_2._M_allocated_capacity._1_7_ << 8;
    local_130._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::_M_append(&local_110,local_90._M_dataplus._M_p,local_90._M_string_length);
    paVar1 = &local_f0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_110._M_dataplus._M_p == paVar2) {
      local_f0.field_2._8_8_ = local_110.field_2._8_8_;
      local_f0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_f0._M_dataplus._M_p = local_110._M_dataplus._M_p;
    }
    local_f0._M_string_length = local_110._M_string_length;
    local_110._M_string_length = 0;
    local_f0.field_2._M_allocated_capacity._1_7_ = local_110.field_2._M_allocated_capacity._1_7_;
    local_110.field_2._M_allocated_capacity =
         (ulong)(uint7)local_110.field_2._M_allocated_capacity._1_7_ << 8;
    local_110._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::append(&local_f0,")");
    uVar3 = local_f0.field_2._M_allocated_capacity._1_7_;
    local_70._M_string_length = local_f0._M_string_length;
    local_b0 = &local_a0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_f0._M_dataplus._M_p == paVar1) {
      local_a0._8_8_ = local_f0.field_2._8_8_;
      local_f0._M_dataplus._M_p = (pointer)local_b0;
    }
    local_f0._M_string_length = 0;
    local_f0.field_2._M_allocated_capacity =
         (ulong)(uint7)local_f0.field_2._M_allocated_capacity._1_7_ << 8;
    local_70._M_dataplus._M_p = local_f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_f0._M_dataplus._M_p == local_b0) {
      local_70.field_2._8_8_ = local_a0._8_8_;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    local_a8 = 0;
    local_a0._M_allocated_capacity = (ulong)(uint7)uVar3 << 8;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    psVar5 = (db->names).
             super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::operator=(&psVar5[-1].first,&local_70);
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::operator=(&psVar5[-1].second,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      free(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      free(local_70._M_dataplus._M_p);
    }
    if (local_b0 != &local_a0) {
      free(local_b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      free(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      free(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      free(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      free(local_d0._M_dataplus._M_p);
    }
    first = pcVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      free(local_90._M_dataplus._M_p);
    }
  }
  return first;
}

Assistant:

const char*
parse_static_cast_expr(const char* first, const char* last, C& db)
{
    if (last - first >= 3 && first[0] == 's' && first[1] == 'c')
    {
        const char* t = parse_type(first+2, last, db);
        if (t != first+2)
        {
            const char* t1 = parse_expression(t, last, db);
            if (t1 != t)
            {
                if (db.names.size() < 2)
                    return first;
                auto expr = db.names.back().move_full();
                db.names.pop_back();
                db.names.back() = "static_cast<" + db.names.back().move_full() + ">(" + expr + ")";
                first = t1;
            }
        }
    }
    return first;
}